

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.c
# Opt level: O0

int oss_open(void)

{
  int iVar1;
  undefined8 uVar2;
  char *__s1;
  ulong uVar3;
  bool bVar4;
  char *force_oss3_cfg;
  _Bool force_oss3;
  int local_4;
  
  bVar4 = false;
  uVar2 = al_get_system_config();
  __s1 = (char *)al_get_config_value(uVar2,"oss","force_ver3");
  if ((__s1 != (char *)0x0) && (*__s1 != '\0')) {
    iVar1 = strcmp(__s1,"yes");
    bVar4 = iVar1 == 0;
  }
  if ((bVar4) &&
     (uVar3 = _al_trace_prefix(__al_debug_channel,2,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                               ,0xf7,"oss_open"), (uVar3 & 1) != 0)) {
    _al_trace_suffix("Skipping OSS4 probe.\n");
  }
  uVar3 = _al_trace_prefix(__al_debug_channel,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                           ,0x107,"oss_open");
  if ((uVar3 & 1) != 0) {
    _al_trace_suffix("OSS4 support not compiled in. Skipping OSS4 probe.\n");
  }
  iVar1 = oss_open_ver3();
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    uVar3 = _al_trace_prefix(__al_debug_channel,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/oss.c"
                             ,0x109,"oss_open");
    if ((uVar3 & 1) != 0) {
      _al_trace_suffix("Failed to init OSS.\n");
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int oss_open(void)
{
   bool force_oss3 = false;
   const char *force_oss3_cfg;
   force_oss3_cfg = al_get_config_value(al_get_system_config(), "oss",
      "force_ver3");
   if (force_oss3_cfg && force_oss3_cfg[0] != '\0')
      force_oss3 = strcmp(force_oss3_cfg, "yes") ? false : true;

   if (force_oss3) {
      ALLEGRO_WARN("Skipping OSS4 probe.\n");
   }

#ifdef OSS_VER_4
   bool inited = false;
   if (!force_oss3) {
      if (oss_open_ver4())
         ALLEGRO_WARN("OSS ver. 4 init failed, trying ver. 3...\n");
      else
         inited = true;
   }
   if (!inited && oss_open_ver3()) {
      ALLEGRO_ERROR("Failed to init OSS.\n");
      return 1;
   }
#else
   ALLEGRO_INFO("OSS4 support not compiled in. Skipping OSS4 probe.\n");
   if (oss_open_ver3()) {
      ALLEGRO_ERROR("Failed to init OSS.\n");
      return 1;
   }
#endif

   return 0;
}